

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * cmsys::SystemTools::RelativePath
                   (string *__return_storage_ptr__,string *local,string *remote)

{
  char cVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  char *__end;
  uint uVar5;
  ulong uVar6;
  pointer pSVar7;
  char *__end_2;
  value_type *__x;
  bool bVar8;
  vector<cmsys::String,_std::allocator<cmsys::String>_> localSplit;
  vector<cmsys::String,_std::allocator<cmsys::String>_> finalPath;
  vector<cmsys::String,_std::allocator<cmsys::String>_> remoteSplit;
  string r;
  string l;
  vector<cmsys::String,_std::allocator<cmsys::String>_> commonPath;
  long *local_100 [2];
  long local_f0 [2];
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_e0;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_c8;
  string *local_a8;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_a0;
  string local_88;
  string local_68;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_48;
  
  local_a8 = remote;
  if ((local->_M_string_length == 0) ||
     ((((cVar1 = *(local->_M_dataplus)._M_p, cVar1 != '/' && (cVar1 != '~')) ||
       (remote->_M_string_length == 0)) ||
      ((cVar1 = *(remote->_M_dataplus)._M_p, cVar1 != '/' && (cVar1 != '~')))))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    CollapseFullPath(&local_68,local,(char *)0x0);
    CollapseFullPath(&local_88,remote,(char *)0x0);
    SplitString(&local_e0,&local_68,'/',true);
    SplitString(&local_a0,&local_88,'/',true);
    local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar4 = 0;
    uVar6 = 1;
    while (uVar5 = (uint)uVar6,
          uVar4 <= ((long)local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      __n = local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4].super_string._M_string_length;
      if ((__n != local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar4].super_string._M_string_length) ||
         ((__x = local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar4, __n != 0 &&
          (iVar3 = bcmp((__x->super_string)._M_dataplus._M_p,
                        local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4].super_string._M_dataplus.
                        _M_p,__n), iVar3 != 0)))) break;
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back(&local_48,__x);
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"","");
      std::__cxx11::string::operator=
                ((string *)
                 (local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar4),(string *)local_100);
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"","");
      std::__cxx11::string::operator=
                ((string *)
                 (local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar4),(string *)local_100);
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      uVar5 = uVar5 + 1;
      bVar8 = ((long)local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 5) - 1U < uVar6;
      uVar4 = uVar6;
      uVar6 = (ulong)uVar5;
      if (bVar8) break;
    }
    if (uVar5 == 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (local_a8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + local_a8->_M_string_length);
    }
    else {
      if (local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        uVar6 = 1;
        do {
          if (local_e0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4].super_string._M_string_length != 0) {
            local_100[0] = local_f0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"../","");
            std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                      (&local_c8,(String *)local_100);
            if (local_100[0] != local_f0) {
              operator_delete(local_100[0],local_f0[0] + 1);
            }
          }
          bVar8 = uVar6 < (ulong)((long)local_e0.
                                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_e0.
                                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar4 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar8);
      }
      if (local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar7 = local_a0.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if ((pSVar7->super_string)._M_string_length != 0) {
            std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back(&local_c8,pSVar7);
          }
          pSVar7 = pSVar7 + 1;
        } while (pSVar7 != local_a0.
                           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      pSVar7 = local_c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          if ((__return_storage_ptr__->_M_string_length != 0) &&
             ((__return_storage_ptr__->_M_dataplus)._M_p
              [__return_storage_ptr__->_M_string_length - 1] != '/')) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(pSVar7->super_string)._M_dataplus._M_p);
          pSVar7 = pSVar7 + 1;
        } while (pSVar7 != local_c8.
                           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_c8);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_48);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_a0);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::RelativePath(const std::string& local,
                                      const std::string& remote)
{
  if (!SystemTools::FileIsFullPath(local)) {
    return "";
  }
  if (!SystemTools::FileIsFullPath(remote)) {
    return "";
  }

  std::string l = SystemTools::CollapseFullPath(local);
  std::string r = SystemTools::CollapseFullPath(remote);

  // split up both paths into arrays of strings using / as a separator
  std::vector<kwsys::String> localSplit =
    SystemTools::SplitString(l, '/', true);
  std::vector<kwsys::String> remoteSplit =
    SystemTools::SplitString(r, '/', true);
  std::vector<kwsys::String>
    commonPath; // store shared parts of path in this array
  std::vector<kwsys::String> finalPath; // store the final relative path here
  // count up how many matching directory names there are from the start
  unsigned int sameCount = 0;
  while (((sameCount <= (localSplit.size() - 1)) &&
          (sameCount <= (remoteSplit.size() - 1))) &&
// for windows and apple do a case insensitive string compare
#if defined(_WIN32) || defined(__APPLE__)
         SystemTools::Strucmp(localSplit[sameCount].c_str(),
                              remoteSplit[sameCount].c_str()) == 0
#else
         localSplit[sameCount] == remoteSplit[sameCount]
#endif
         ) {
    // put the common parts of the path into the commonPath array
    commonPath.push_back(localSplit[sameCount]);
    // erase the common parts of the path from the original path arrays
    localSplit[sameCount] = "";
    remoteSplit[sameCount] = "";
    sameCount++;
  }